

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddLin.c
# Opt level: O2

int cuddZddLinearBackward(DdManager *table,int size,Move *moves)

{
  int iVar1;
  Move *pMVar2;
  
  for (pMVar2 = moves; pMVar2 != (Move *)0x0; pMVar2 = pMVar2->next) {
    if (pMVar2->size < size) {
      size = pMVar2->size;
    }
  }
  while( true ) {
    if ((moves == (Move *)0x0) || (moves->size == size)) {
      return 1;
    }
    if ((moves->flags == 1) && (iVar1 = cuddZddLinearInPlace(table,moves->x,moves->y), iVar1 == 0))
    break;
    iVar1 = cuddZddSwapInPlace(table,moves->x,moves->y);
    if (iVar1 == 0) {
      return 0;
    }
    if ((moves->flags == 2) && (iVar1 = cuddZddLinearInPlace(table,moves->x,moves->y), iVar1 == 0))
    {
      return 0;
    }
    moves = moves->next;
  }
  return 0;
}

Assistant:

static int
cuddZddLinearBackward(
  DdManager * table,
  int  size,
  Move * moves)
{
    Move        *move;
    int         res;

    /* Find the minimum size among moves. */
    for (move = moves; move != NULL; move = move->next) {
        if (move->size < size) {
            size = move->size;
        }
    }

    for (move = moves; move != NULL; move = move->next) {
        if (move->size == size) return(1);
        if (move->flags == CUDD_LINEAR_TRANSFORM_MOVE) {
            res = cuddZddLinearInPlace(table,(int)move->x,(int)move->y);
            if (!res) return(0);
        }
        res = cuddZddSwapInPlace(table, move->x, move->y);
        if (!res)
            return(0);
        if (move->flags == CUDD_INVERSE_TRANSFORM_MOVE) {
            res = cuddZddLinearInPlace(table,(int)move->x,(int)move->y);
            if (!res) return(0);
        }
    }

    return(1);

}